

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

Slice __thiscall leveldb::FilterBlockBuilder::Finish(FilterBlockBuilder *this)

{
  bool bVar1;
  uint32_t value;
  size_type sVar2;
  reference pvVar3;
  string *dst;
  ulong local_30;
  size_t i;
  uint32_t array_offset;
  FilterBlockBuilder *this_local;
  
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->start_);
  if (!bVar1) {
    GenerateFilter(this);
  }
  value = std::__cxx11::string::size();
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->filter_offsets_);
    if (sVar2 <= local_30) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->filter_offsets_,local_30);
    PutFixed32(&this->result_,*pvVar3);
    local_30 = local_30 + 1;
  }
  dst = &this->result_;
  PutFixed32(dst,value);
  std::__cxx11::string::push_back((char)dst);
  Slice::Slice((Slice *)&this_local,dst);
  return _this_local;
}

Assistant:

Slice FilterBlockBuilder::Finish() {
  if (!start_.empty()) {
    GenerateFilter();
  }

  // Append array of per-filter offsets
  const uint32_t array_offset = result_.size();
  for (size_t i = 0; i < filter_offsets_.size(); i++) {
    PutFixed32(&result_, filter_offsets_[i]);
  }

  PutFixed32(&result_, array_offset);
  result_.push_back(kFilterBaseLg);  // Save encoding parameter in result
  return Slice(result_);
}